

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmThrowErrorAp(jx9_vm *pVm,SyString *pFuncName,sxi32 iErr,char *zFormat,__va_list_tag *ap)

{
  sxu32 nSize;
  SyBlob *pBlob;
  undefined8 *puVar1;
  char *pcStack_50;
  sxi32 rc;
  char *zErr;
  SyString *pFile;
  SyBlob *pWorker;
  __va_list_tag *ap_local;
  char *zFormat_local;
  sxi32 iErr_local;
  SyString *pFuncName_local;
  jx9_vm *pVm_local;
  
  pBlob = &pVm->sWorker;
  if (pVm->bErrReport == 0) {
    pVm_local._4_4_ = 0;
  }
  else {
    SyBlobReset(pBlob);
    puVar1 = (undefined8 *)SySetPeek(&pVm->aFiles);
    if (puVar1 != (undefined8 *)0x0) {
      SyBlobAppend(pBlob,(void *)*puVar1,*(sxu32 *)(puVar1 + 1));
      SyBlobAppend(pBlob," ",1);
    }
    pcStack_50 = "Error: ";
    if (iErr == 2) {
      pcStack_50 = "Warning: ";
    }
    else if (iErr == 3) {
      pcStack_50 = "Notice: ";
    }
    nSize = SyStrlen(pcStack_50);
    SyBlobAppend(pBlob,pcStack_50,nSize);
    if (pFuncName != (SyString *)0x0) {
      SyBlobAppend(pBlob,pFuncName->zString,pFuncName->nByte);
      SyBlobAppend(pBlob,"(): ",4);
    }
    SyBlobFormatAp(pBlob,zFormat,ap);
    pVm_local._4_4_ = VmCallErrorHandler(pVm,pBlob);
  }
  return pVm_local._4_4_;
}

Assistant:

static sxi32 VmThrowErrorAp(
	jx9_vm *pVm,         /* Target VM */
	SyString *pFuncName, /* Function name. NULL otherwise */
	sxi32 iErr,          /* Severity level: [i.e: Error, Warning or Notice] */
	const char *zFormat, /* Format message */
	va_list ap           /* Variable list of arguments */
	)
{
	SyBlob *pWorker = &pVm->sWorker;
	SyString *pFile;
	char *zErr;
	sxi32 rc;
	if( !pVm->bErrReport ){
		/* Don't bother reporting errors */
		return SXRET_OK;
	}
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	/* Peek the processed file if available */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile ){
		/* Append file name */
		SyBlobAppend(pWorker, pFile->zString, pFile->nByte);
		SyBlobAppend(pWorker, (const void *)" ", sizeof(char));
	}
	zErr = "Error: ";
	switch(iErr){
	case JX9_CTX_WARNING: zErr = "Warning: "; break;
	case JX9_CTX_NOTICE:  zErr = "Notice: ";  break;
	default:
		iErr = JX9_CTX_ERR;
		break;
	}
	SyBlobAppend(pWorker, zErr, SyStrlen(zErr));
	if( pFuncName ){
		/* Append function name first */
		SyBlobAppend(pWorker, pFuncName->zString, pFuncName->nByte);
		SyBlobAppend(pWorker, "(): ", sizeof("(): ")-1);
	}
	SyBlobFormatAp(pWorker, zFormat, ap);
	/* Consume the error message */
	rc = VmCallErrorHandler(&(*pVm), pWorker);
	return rc;
}